

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

ProcessorBase * __thiscall
soul::AST::Scope::findSingleMatchingProcessor(Scope *this,QualifiedIdentifier *name)

{
  bool bVar1;
  ModuleBase *pMVar2;
  ProcessorBase *pPVar3;
  IdentifierPath local_b0;
  CompileMessage local_58;
  pool_ptr<soul::AST::ProcessorBase> local_20;
  pool_ptr<soul::AST::ProcessorBase> p;
  QualifiedIdentifier *name_local;
  Scope *this_local;
  
  p.object = (ProcessorBase *)name;
  pMVar2 = findSingleMatchingSubModule(this,name);
  cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_20,pMVar2);
  bVar1 = pool_ptr<soul::AST::ProcessorBase>::operator==(&local_20,(void *)0x0);
  if (!bVar1) {
    pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_20);
    pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_20);
    return pPVar3;
  }
  pMVar2 = &(p.object)->super_ModuleBase;
  QualifiedIdentifier::getPath(&local_b0,(QualifiedIdentifier *)p.object);
  Errors::notAProcessorOrGraph<soul::IdentifierPath>(&local_58,&local_b0);
  Context::throwError(&(pMVar2->super_ASTObject).context,&local_58,false);
}

Assistant:

ProcessorBase& findSingleMatchingProcessor (const QualifiedIdentifier& name) const
        {
            auto p = cast<ProcessorBase> (findSingleMatchingSubModule (name));

            if (p == nullptr)
                name.context.throwError (Errors::notAProcessorOrGraph (name.getPath()));

            return *p;
        }